

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FixSrcList(DbFixer *pFix,SrcList *pList)

{
  char *zRight;
  int iVar1;
  SrcList_item *local_38;
  SrcList_item *pItem;
  char *zDb;
  int i;
  SrcList *pList_local;
  DbFixer *pFix_local;
  
  if (pList != (SrcList *)0x0) {
    zRight = pFix->zDb;
    local_38 = pList->a;
    for (zDb._4_4_ = 0; zDb._4_4_ < pList->nSrc; zDb._4_4_ = zDb._4_4_ + 1) {
      if (pFix->bVarOnly == 0) {
        if ((local_38->zDatabase != (char *)0x0) &&
           (iVar1 = sqlite3StrICmp(local_38->zDatabase,zRight), iVar1 != 0)) {
          sqlite3ErrorMsg(pFix->pParse,"%s %T cannot reference objects in database %s",pFix->zType,
                          pFix->pName,local_38->zDatabase);
          return 1;
        }
        sqlite3DbFree(pFix->pParse->db,local_38->zDatabase);
        local_38->zDatabase = (char *)0x0;
        local_38->pSchema = pFix->pSchema;
      }
      iVar1 = sqlite3FixSelect(pFix,local_38->pSelect);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = sqlite3FixExpr(pFix,local_38->pOn);
      if (iVar1 != 0) {
        return 1;
      }
      if ((((byte)(local_38->fg).field_0x1 >> 2 & 1) != 0) &&
         (iVar1 = sqlite3FixExprList(pFix,(local_38->u1).pFuncArg), iVar1 != 0)) {
        return 1;
      }
      local_38 = local_38 + 1;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixSrcList(
  DbFixer *pFix,       /* Context of the fixation */
  SrcList *pList       /* The Source list to check and modify */
){
  int i;
  const char *zDb;
  struct SrcList_item *pItem;

  if( NEVER(pList==0) ) return 0;
  zDb = pFix->zDb;
  for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
    if( pFix->bVarOnly==0 ){
      if( pItem->zDatabase && sqlite3StrICmp(pItem->zDatabase, zDb) ){
        sqlite3ErrorMsg(pFix->pParse,
            "%s %T cannot reference objects in database %s",
            pFix->zType, pFix->pName, pItem->zDatabase);
        return 1;
      }
      sqlite3DbFree(pFix->pParse->db, pItem->zDatabase);
      pItem->zDatabase = 0;
      pItem->pSchema = pFix->pSchema;
    }
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_TRIGGER)
    if( sqlite3FixSelect(pFix, pItem->pSelect) ) return 1;
    if( sqlite3FixExpr(pFix, pItem->pOn) ) return 1;
#endif
    if( pItem->fg.isTabFunc && sqlite3FixExprList(pFix, pItem->u1.pFuncArg) ){
      return 1;
    }
  }
  return 0;
}